

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

Vec_Int_t * Gia_ManGetDangling(Gia_Man_t *p)

{
  byte *pbVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  long lVar7;
  uint uVar8;
  
  if (0 < p->nObjs) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      pGVar6 = p->pObjs;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      uVar2 = *(ulong *)(&pGVar6->field_0x0 + lVar4);
      *(ulong *)(&pGVar6->field_0x0 + lVar4) = uVar2 & 0xffffffffbfffffff;
      uVar8 = (uint)(uVar2 & 0x1fffffff);
      if ((uVar2 & 0x1fffffff) == 0x1fffffff || (int)uVar2 < 0) {
        if ((int)uVar2 < 0 && uVar8 != 0x1fffffff) goto LAB_00789342;
      }
      else {
        pbVar1 = (byte *)((long)pGVar6 + (ulong)(uVar8 << 2) * -3 + lVar4 + 3);
        *pbVar1 = *pbVar1 | 0x40;
        uVar8 = *(uint *)(&pGVar6->field_0x4 + lVar4) & 0x1fffffff;
LAB_00789342:
        pbVar1 = (byte *)((long)pGVar6 + lVar4 + (ulong)(uVar8 << 2) * -3 + 3);
        *pbVar1 = *pbVar1 | 0x40;
      }
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar7 < p->nObjs);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_00->pArray = piVar5;
  if (p->nObjs < 1) {
    bVar3 = false;
  }
  else {
    pGVar6 = p->pObjs;
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      bVar3 = true;
    }
    else {
      lVar7 = 1;
      lVar4 = 0;
      do {
        if ((*(ulong *)(&pGVar6->field_0x0 + lVar4) & 0xc0000000) == 0 &&
            (~(uint)*(ulong *)(&pGVar6->field_0x0 + lVar4) & 0x1fffffff) != 0) {
          Vec_IntPush(p_00,(int)lVar7 + -1);
        }
        if (p->nObjs <= lVar7) break;
        pGVar6 = p->pObjs;
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + 0xc;
      } while (pGVar6 != (Gia_Obj_t *)0x0);
      bVar3 = 0 < p->nObjs;
    }
  }
  if (bVar3) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      pbVar1 = &p->pObjs->field_0x3 + lVar4;
      *pbVar1 = *pbVar1 & 0xbf;
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar7 < p->nObjs);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManGetDangling( Gia_Man_t * p )
{
    Vec_Int_t * vDangles;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
    vDangles = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( p, pObj, i )
        if ( !pObj->fMark0 )
            Vec_IntPush( vDangles, i );
    Gia_ManCleanMark0( p );
    return vDangles;
}